

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# from_current.cpp
# Opt level: O1

int cpptrace::detail::get_page_protections(void *page)

{
  istream *piVar1;
  runtime_error *prVar2;
  uint uVar3;
  int iVar4;
  uint unaff_R13D;
  char x;
  char w;
  char r;
  uintptr_t stop;
  uintptr_t start;
  ifstream stream;
  char local_24b;
  char local_24a;
  char local_249;
  void *local_248;
  void *local_240;
  long local_238 [3];
  uint auStack_220 [2];
  uint auStack_218 [122];
  
  std::ifstream::ifstream((istream *)local_238,"/proc/self/maps",_S_in);
  *(uint *)((long)auStack_220 + *(long *)(local_238[0] + -0x18)) =
       *(uint *)((long)auStack_220 + *(long *)(local_238[0] + -0x18)) & 0xffffffb5 | 8;
  do {
    if ((*(byte *)((long)auStack_218 + *(long *)(local_238[0] + -0x18)) & 2) != 0)
    goto LAB_001782d2;
    std::istream::_M_extract<unsigned_long>((ulong *)local_238);
    std::istream::ignore((long)local_238);
    std::istream::_M_extract<unsigned_long>((ulong *)local_238);
    uVar3 = *(uint *)((long)auStack_218 + *(long *)(local_238[0] + -0x18));
    iVar4 = 3;
    if ((uVar3 & 2) == 0) {
      if ((uVar3 & 5) != 0) {
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar2,"Failure reading /proc/self/maps");
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if ((page < local_240) || (local_248 <= page)) {
        iVar4 = 0;
        std::istream::ignore((long)local_238,-1);
      }
      else {
        std::istream::ignore((long)local_238);
        piVar1 = std::operator>>((istream *)local_238,&local_249);
        piVar1 = std::operator>>(piVar1,&local_24a);
        std::operator>>(piVar1,&local_24b);
        if ((*(byte *)((long)auStack_218 + *(long *)(local_238[0] + -0x18)) & 7) != 0) {
          prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar2,"Failure reading /proc/self/maps");
          __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        uVar3 = (local_249 == 'r') + 2;
        if (local_24a != 'w') {
          uVar3 = (uint)(local_249 == 'r');
        }
        unaff_R13D = uVar3 + 4;
        if (local_24b != 'x') {
          unaff_R13D = uVar3;
        }
        iVar4 = 1;
      }
    }
  } while (iVar4 == 0);
  if (iVar4 != 3) {
    std::ifstream::~ifstream(local_238);
    return unaff_R13D;
  }
LAB_001782d2:
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar2,"Failed to find mapping with page in /proc/self/maps");
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int get_page_protections(void* page) {
            auto page_addr = reinterpret_cast<uintptr_t>(page);
            std::ifstream stream("/proc/self/maps");
            stream>>std::hex;
            while(!stream.eof()) {
                uintptr_t start;
                uintptr_t stop;
                stream>>start;
                stream.ignore(1); // dash
                stream>>stop;
                if(stream.eof()) {
                    break;
                }
                if(stream.fail()) {
                    throw std::runtime_error("Failure reading /proc/self/maps");
                }
                if(page_addr >= start && page_addr < stop) {
                    stream.ignore(1); // space
                    char r, w, x; // there's a private/shared flag after these but we don't need it
                    stream>>r>>w>>x;
                    if(stream.fail() || stream.eof()) {
                        throw std::runtime_error("Failure reading /proc/self/maps");
                    }
                    int perms = 0;
                    if(r == 'r') {
                        perms |= PROT_READ;
                    }
                    if(w == 'w') {
                        perms |= PROT_WRITE;
                    }
                    if(x == 'x') {
                        perms |= PROT_EXEC;
                    }
                    // std::cerr<<"--parsed: "<<std::hex<<start<<" "<<stop<<" "<<r<<w<<x<<std::endl;
                    return perms;
                }
                stream.ignore(std::numeric_limits<std::streamsize>::max(), '\n');
            }
            throw std::runtime_error("Failed to find mapping with page in /proc/self/maps");
        }